

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms.c
# Opt level: O2

int deleteFile(char *filepath)

{
  int fd;
  int iVar1;
  int iVar2;
  stat st;
  
  iVar2 = 2;
  fd = open(filepath,2);
  if (fd < 0) {
    fwrite("Failed opening file.\n",0x15,1,_stderr);
  }
  else {
    iVar2 = 0;
    memset(&st,0,0x90);
    lstat(filepath,(stat *)&st);
    iVar1 = writeOver(fd,(int)st.st_size,0x20000);
    if (iVar1 == 0) {
      close(fd);
      unlink(filepath);
    }
    else {
      fwrite("Error overwriting file.\n",0x18,1,_stderr);
      iVar2 = 3;
    }
  }
  return iVar2;
}

Assistant:

int deleteFile(const char *filepath) {
  int fd = open(filepath, O_RDWR);
  if (fd < 0) {
    fprintf(stderr, "Failed opening file.\n");
    return 2;
  }

  struct stat st = {};
  lstat(filepath, &st);
  if (writeOver(fd, st.st_size, BUF_SIZE)) {
    fprintf(stderr, "Error overwriting file.\n");
    return 3;
  }

  //close and delete file
  close(fd);
  unlink(filepath);
  return 0;
}